

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_codegen.c
# Opt level: O3

void visit_binary_expr(gvisitor_t *self,gnode_binary_expr_t *node)

{
  gnode_n gVar1;
  int *piVar2;
  bool bVar3;
  _Bool _Var4;
  char *format;
  gnode_t *pgVar5;
  gnode_binary_expr_t *expr;
  bool bVar6;
  
  gVar1 = node->left->tag;
  if (gVar1 != NODE_FLOW_STAT && 10 < gVar1 - NODE_BINARY_EXPR) {
    report_error(self,GRAVITY_ERROR_SEMANTIC,node->left,"LValue must be an expression.");
  }
  gVar1 = node->right->tag;
  if (gVar1 != NODE_FLOW_STAT && 10 < gVar1 - NODE_BINARY_EXPR) {
    report_error(self,GRAVITY_ERROR_SEMANTIC,node->right,"RValue must be an expression.");
  }
  gvisit(self,node->left);
  gvisit(self,node->right);
  pgVar5 = node->left;
  _Var4 = is_expression_valid(pgVar5);
  if (!_Var4) {
    report_error(self,GRAVITY_ERROR_SEMANTIC,pgVar5,"Invalid left expression.");
  }
  pgVar5 = node->right;
  _Var4 = is_expression_valid(pgVar5);
  if (!_Var4) {
    report_error(self,GRAVITY_ERROR_SEMANTIC,pgVar5,"Invalid right expression.");
  }
  if ((node->base).tag != NODE_BINARY_EXPR) {
    return;
  }
  if (node->op != TOK_OP_ASSIGN) {
    if (1 < node->op - TOK_OP_RANGE_EXCLUDED) {
      return;
    }
    pgVar5 = node->left;
    bVar6 = true;
    while ((pgVar5->tag != NODE_LITERAL_EXPR || (pgVar5[1].tag == NODE_LABEL_STAT))) {
      bVar3 = !bVar6;
      pgVar5 = node->right;
      bVar6 = false;
      if (bVar3) {
        return;
      }
    }
    format = "Range must be integer.";
    goto LAB_0011e765;
  }
  node = (gnode_binary_expr_t *)node->left;
  gVar1 = (node->base).tag;
  if (gVar1 == NODE_FILE_EXPR) {
LAB_0011e6d0:
    (node->base).is_assignment = true;
    return;
  }
  if (gVar1 == NODE_POSTFIX_EXPR) {
    if ((*(int **)&node->op != (int *)0x0) && (**(int **)&node->op == 0x11)) goto LAB_0011e714;
    pgVar5 = node->left;
    if (pgVar5 == (gnode_t *)0x0) {
      return;
    }
    if (*(long *)pgVar5 == 0) {
      return;
    }
    piVar2 = *(int **)(*(long *)&pgVar5->token + -8 + *(long *)pgVar5 * 8);
    if (piVar2 == (int *)0x0) {
      return;
    }
    bVar6 = *piVar2 != 0x15;
    (node->base).is_assignment = bVar6;
    if (bVar6) {
      return;
    }
  }
  else {
    if (gVar1 == NODE_IDENTIFIER_EXPR) goto LAB_0011e6d0;
LAB_0011e714:
    (node->base).is_assignment = false;
  }
  format = "Wrong assignment expression.";
LAB_0011e765:
  report_error(self,GRAVITY_ERROR_SEMANTIC,&node->base,format);
  return;
}

Assistant:

static void visit_binary_expr (gvisitor_t *self, gnode_binary_expr_t *node) {
    DEBUG_CODEGEN("visit_binary_expr %s", token_name(node->op));
    DECLARE_CODE();

    // assignment is right associative
    if (node->op == TOK_OP_ASSIGN) {
        CODEGEN_COUNT_REGISTERS(n1);

        visit(node->right);
        visit(node->left);    // left expression can be: IDENTIFIER, FILE, POSTIFIX (not a call)

        CODEGEN_COUNT_REGISTERS(n2);
        CODEGEN_ASSERT_REGISTERS(n1, n2, 0);
        
        // Checkpoint added to support STRUCT
        ircode_add_check(code);
        return;
    }

    CODEGEN_COUNT_REGISTERS(n1);

    // visiting binary operation from left to right
    visit(node->left);
    visit(node->right);

    uint32_t r3 = ircode_register_pop(code);
    if (r3 == REGISTER_ERROR) report_error(self, (gnode_t *)node->right, "Invalid right expression.");
    uint32_t r2 = ircode_register_pop(code);
    if (r2 == REGISTER_ERROR) report_error(self, (gnode_t *)node->left, "Invalid left expression.");
    uint32_t r1 = ircode_register_push_temp(code);

    // a special instruction needs to be generated for a binary expression of type RANGE
    if ((node->op == TOK_OP_RANGE_INCLUDED) || (node->op == TOK_OP_RANGE_EXCLUDED)) {
		ircode_add_tag(code, RANGENEW, r1, r2, r3, (node->op == TOK_OP_RANGE_INCLUDED) ? RANGE_INCLUDE_TAG : RANGE_EXCLUDE_TAG, LINE_NUMBER(node));
        return;
    }

    // generate code for binary OP
    opcode_t op = token2opcode(node->op);
	ircode_add(code, op, r1, r2, r3, LINE_NUMBER(node));

    CODEGEN_COUNT_REGISTERS(n2);
    CODEGEN_ASSERT_REGISTERS(n1, n2, 1);
}